

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.c
# Opt level: O0

void ZSTD_DCtx_trace_end(ZSTD_DCtx *dctx,U64 uncompressedSize,U64 compressedSize,uint streaming)

{
  undefined4 local_68;
  uint local_64;
  ZSTD_Trace trace;
  uint streaming_local;
  U64 compressedSize_local;
  U64 uncompressedSize_local;
  ZSTD_DCtx *dctx_local;
  
  if (dctx->traceCtx != 0) {
    trace.dctx._4_4_ = streaming;
    memset(&local_68,0,0x40);
    local_68 = 0x2909;
    local_64 = trace.dctx._4_4_;
    if (dctx->ddict != (ZSTD_DDict *)0x0) {
      trace.version = ZSTD_getDictID_fromDDict(dctx->ddict);
      trace._8_8_ = ZSTD_DDict_dictSize(dctx->ddict);
      trace.streaming = dctx->ddictIsCold;
    }
    trace.dictionarySize = uncompressedSize;
    trace.uncompressedSize = compressedSize;
    trace.cctx = (ZSTD_CCtx_s *)dctx;
    ZSTD_trace_decompress_end(dctx->traceCtx,&local_68);
  }
  return;
}

Assistant:

static void ZSTD_DCtx_trace_end(ZSTD_DCtx const* dctx, U64 uncompressedSize, U64 compressedSize, unsigned streaming)
{
#if ZSTD_TRACE
    if (dctx->traceCtx && ZSTD_trace_decompress_end != NULL) {
        ZSTD_Trace trace;
        ZSTD_memset(&trace, 0, sizeof(trace));
        trace.version = ZSTD_VERSION_NUMBER;
        trace.streaming = streaming;
        if (dctx->ddict) {
            trace.dictionaryID = ZSTD_getDictID_fromDDict(dctx->ddict);
            trace.dictionarySize = ZSTD_DDict_dictSize(dctx->ddict);
            trace.dictionaryIsCold = dctx->ddictIsCold;
        }
        trace.uncompressedSize = (size_t)uncompressedSize;
        trace.compressedSize = (size_t)compressedSize;
        trace.dctx = dctx;
        ZSTD_trace_decompress_end(dctx->traceCtx, &trace);
    }
#else
    (void)dctx;
    (void)uncompressedSize;
    (void)compressedSize;
    (void)streaming;
#endif
}